

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easm_xfrm.c
# Opt level: O0

int easm_cfold_expr(easm_expr *expr)

{
  ulong uVar1;
  bool local_3a;
  bool local_39;
  uint64_t x;
  uint64_t val;
  int e2f;
  int e1f;
  easm_expr *expr_local;
  
  if (expr->type == EASM_EXPR_NUM) {
    expr_local._4_4_ = 1;
  }
  else {
    val._4_4_ = 1;
    val._0_4_ = 1;
    if (expr->e1 != (easm_expr *)0x0) {
      val._4_4_ = easm_cfold_expr(expr->e1);
    }
    if (expr->e2 != (easm_expr *)0x0) {
      val._0_4_ = easm_cfold_expr(expr->e2);
    }
    if (expr->sinsn != (easm_sinsn *)0x0) {
      easm_cfold_sinsn(expr->sinsn);
    }
    if ((((val._4_4_ == 0) || ((int)val == 0)) || (expr->type == EASM_EXPR_VEC)) ||
       (EASM_EXPR_LNOT < expr->type)) {
      expr_local._4_4_ = 0;
    }
    else {
      switch(expr->type) {
      case EASM_EXPR_LOR:
        local_3a = true;
        if (expr->e1->num == 0) {
          local_3a = expr->e2->num != 0;
        }
        x = (uint64_t)(int)(uint)local_3a;
        break;
      case EASM_EXPR_LAND:
        local_39 = false;
        if (expr->e1->num != 0) {
          local_39 = expr->e2->num != 0;
        }
        x = (uint64_t)(int)(uint)local_39;
        break;
      case EASM_EXPR_OR:
        x = expr->e1->num | expr->e2->num;
        break;
      case EASM_EXPR_XOR:
        x = expr->e1->num ^ expr->e2->num;
        break;
      case EASM_EXPR_AND:
        x = expr->e1->num & expr->e2->num;
        break;
      case EASM_EXPR_SHL:
        x = expr->e1->num << ((byte)expr->e2->num & 0x3f);
        break;
      case EASM_EXPR_SHR:
        x = expr->e1->num >> ((byte)expr->e2->num & 0x3f);
        break;
      case EASM_EXPR_ADD:
        x = expr->e1->num + expr->e2->num;
        break;
      case EASM_EXPR_SUB:
        x = expr->e1->num - expr->e2->num;
        break;
      case EASM_EXPR_MUL:
        x = expr->e1->num * expr->e2->num;
        break;
      case EASM_EXPR_DIV:
        uVar1 = expr->e2->num;
        if (uVar1 == 0) {
          fprintf(_stderr,"%s:%d.%d-%d.%d: Division by 0\n",(expr->loc).file,
                  (ulong)(uint)(expr->loc).lstart,(ulong)(uint)(expr->loc).cstart,
                  (ulong)(uint)(expr->loc).lend,(expr->loc).cend);
          return 0;
        }
        x = expr->e1->num / uVar1;
        break;
      case EASM_EXPR_MOD:
        uVar1 = expr->e2->num;
        if (uVar1 == 0) {
          fprintf(_stderr,"%s:%d.%d-%d.%d: Division by 0\n",(expr->loc).file,
                  (ulong)(uint)(expr->loc).lstart,(ulong)(uint)(expr->loc).cstart,
                  (ulong)(uint)(expr->loc).lend,(expr->loc).cend);
          return 0;
        }
        x = expr->e1->num % uVar1;
        break;
      case EASM_EXPR_NEG:
        x = -expr->e1->num;
        break;
      case EASM_EXPR_NOT:
        x = expr->e1->num ^ 0xffffffffffffffff;
        break;
      case EASM_EXPR_LNOT:
        x = (uint64_t)(int)(uint)((expr->e1->num != 0 ^ 0xffU) & 1);
        break;
      default:
        abort();
      }
      easm_del_expr(expr->e1);
      easm_del_expr(expr->e2);
      expr->e1 = (easm_expr *)0x0;
      expr->e2 = (easm_expr *)0x0;
      expr->num = x;
      expr->type = EASM_EXPR_NUM;
      expr_local._4_4_ = 1;
    }
  }
  return expr_local._4_4_;
}

Assistant:

int easm_cfold_expr(struct easm_expr *expr) {
	if (expr->type == EASM_EXPR_NUM)
		return 1;
	int e1f = 1, e2f = 1;
	if (expr->e1)
		e1f = easm_cfold_expr(expr->e1);
	if (expr->e2)
		e2f = easm_cfold_expr(expr->e2);
	if (expr->sinsn)
		easm_cfold_sinsn(expr->sinsn);
	if (!e1f || !e2f || expr->type < EASM_EXPR_LOR || expr->type > EASM_EXPR_LNOT)
		return 0;
	uint64_t val;
	uint64_t x;
	switch (expr->type) {
		case EASM_EXPR_NEG:
			val = -expr->e1->num;
			break;
		case EASM_EXPR_NOT:
			val = ~expr->e1->num;
			break;
		case EASM_EXPR_LNOT:
			val = !expr->e1->num;
			break;
		case EASM_EXPR_MUL:
			val = expr->e1->num * expr->e2->num;
			break;
		case EASM_EXPR_DIV:
			x = expr->e2->num;
			if (x)
				val = expr->e1->num / x;
			else {
				fprintf (stderr, LOC_FORMAT(expr->loc, "Division by 0\n"));
				return 0;
			}
			break;
		case EASM_EXPR_MOD:
			x = expr->e2->num;
			if (x)
				val = expr->e1->num % x;
			else {
				fprintf (stderr, LOC_FORMAT(expr->loc, "Division by 0\n"));
				return 0;
			}
			break;
		case EASM_EXPR_ADD:
			val = expr->e1->num + expr->e2->num;
			break;
		case EASM_EXPR_SUB:
			val = expr->e1->num - expr->e2->num;
			break;
		case EASM_EXPR_SHL:
			val = expr->e1->num << expr->e2->num;
			break;
		case EASM_EXPR_SHR:
			val = expr->e1->num >> expr->e2->num;
			break;
		case EASM_EXPR_AND:
			val = expr->e1->num & expr->e2->num;
			break;
		case EASM_EXPR_XOR:
			val = expr->e1->num ^ expr->e2->num;
			break;
		case EASM_EXPR_OR:
			val = expr->e1->num | expr->e2->num;
			break;
		case EASM_EXPR_LAND:
			val = expr->e1->num && expr->e2->num;
			break;
		case EASM_EXPR_LOR:
			val = expr->e1->num || expr->e2->num;
			break;
		default:
			abort();
	}
	easm_del_expr(expr->e1);
	easm_del_expr(expr->e2);
	expr->e1 = 0;
	expr->e2 = 0;
	expr->num = val;
	expr->type = EASM_EXPR_NUM;
	return 1;
}